

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckBlock
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *this;
  bool bVar2;
  byte local_132;
  byte local_131;
  AActor *local_130;
  bool local_11f;
  int u_2;
  AActor *setter;
  undefined1 local_108 [4];
  int u_1;
  uint local_f8;
  byte local_f1;
  int fpass;
  bool checker;
  double local_d8;
  double c;
  double s;
  undefined1 local_b0 [8];
  DVector3 pos;
  DVector3 oldpos;
  int u;
  AActor *mobj;
  DAngle angle;
  double zofs;
  double yofs;
  double xofs;
  int ptr;
  int flags;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1992,
                  "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    local_130 = (AActor *)(param->field_0).field_1.a;
    local_11f = true;
    if (local_130 != (AActor *)0x0) {
      local_11f = DObject::IsKindOf((DObject *)local_130,AActor::RegistrationInfo.MyClass);
    }
    if (local_11f != false) {
      if (numparam < 2) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1993,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        xofs._4_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1993,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        xofs._4_4_ = param[1].field_0.i;
      }
      if (numparam < 3) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1994,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        xofs._0_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1994,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        xofs._0_4_ = param[2].field_0.i;
      }
      if (numparam < 4) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1995,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        yofs = (pVVar1->field_0).f;
      }
      else {
        if (param[3].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1995,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        yofs = param[3].field_0.f;
      }
      if (numparam < 5) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1996,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        zofs = (pVVar1->field_0).f;
      }
      else {
        if (param[4].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1996,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        zofs = param[4].field_0.f;
      }
      if (numparam < 6) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1997,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        angle.Degrees = (double)(pVVar1->field_0).field_1.a;
      }
      else {
        if (param[5].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1997,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        angle.Degrees = (double)param[5].field_0.field_1.a;
      }
      TAngle<double>::TAngle((TAngle<double> *)&mobj);
      if (numparam < 7) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1998,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        TAngle<double>::operator=((TAngle<double> *)&mobj,(pVVar1->field_0).f);
      }
      else {
        if (param[6].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1998,
                        "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        TAngle<double>::operator=((TAngle<double> *)&mobj,param[6].field_0.f);
      }
      this = COPY_AAPTR(local_130,xofs._0_4_);
      if (this == (AActor *)0x0) {
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x199f,
                          "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,0);
          param_local._4_4_ = 1;
        }
      }
      else {
        if ((xofs._4_4_ & 0x100) == 0) {
          TAngle<double>::TAngle((TAngle<double> *)&oldpos.Z,&(local_130->Angles).Yaw);
          TAngle<double>::operator+=((TAngle<double> *)&mobj,(TAngle<double> *)&oldpos.Z);
        }
        AActor::Pos((DVector3 *)&pos.Z,this);
        TVector3<double>::TVector3((TVector3<double> *)local_b0);
        if ((xofs._4_4_ & 0x80) == 0) {
          c = TAngle<double>::Sin((TAngle<double> *)&mobj);
          local_d8 = TAngle<double>::Cos((TAngle<double> *)&mobj);
          AActor::Vec3Offset((DVector3 *)&fpass,this,yofs * local_d8 + zofs * c,
                             yofs * c - zofs * local_d8,angle.Degrees,false);
          TVector3<double>::operator=((TVector3<double> *)local_b0,(TVector3<double> *)&fpass);
        }
        else {
          TVector3<double>::TVector3((TVector3<double> *)&s,yofs,zofs,angle.Degrees);
          TVector3<double>::operator=((TVector3<double> *)local_b0,(TVector3<double> *)&s);
        }
        local_f1 = 0;
        if ((xofs._4_4_ & 0x20) == 0) {
          AActor::SetOrigin(this,(DVector3 *)local_b0,true);
          local_f1 = P_TestMobjLocation(this);
          AActor::SetOrigin(this,(DVector3 *)&pos.Z,true);
        }
        else {
          local_f8 = 1;
          if ((xofs._4_4_ & 0x40) != 0) {
            local_f8 = 3;
          }
          if ((xofs._4_4_ & 1) != 0) {
            local_f8 = local_f8 | 4;
          }
          AActor::SetZ(this,pos.Y,true);
          TVector2<double>::TVector2((TVector2<double> *)local_108,(TVector3<double> *)local_b0);
          local_f1 = P_CheckMove(this,(DVector2 *)local_108,local_f8);
          AActor::SetZ(this,oldpos.Y,true);
        }
        if ((local_f1 & 1) == 0) {
          if (this->BlockingMobj != (AActor *)0x0) {
            if ((xofs._4_4_ & 0x10) != 0) {
              local_130 = this;
            }
            if (local_130 != (AActor *)0x0) {
              if ((xofs._4_4_ & 2) != 0) {
                TObjPtr<AActor>::operator=(&local_130->target,this->BlockingMobj);
              }
              if ((xofs._4_4_ & 4) != 0) {
                TObjPtr<AActor>::operator=(&local_130->master,this->BlockingMobj);
              }
              if ((xofs._4_4_ & 8) != 0) {
                TObjPtr<AActor>::operator=(&local_130->tracer,this->BlockingMobj);
              }
            }
          }
          if ((((xofs._4_4_ & 0x40) != 0) || (local_131 = 1, this->BlockingMobj == (AActor *)0x0))
             && (((xofs._4_4_ & 1) != 0 || (local_131 = 1, this->BlockingLine == (line_t *)0x0)))) {
            local_132 = 0;
            if ((xofs._4_4_ & 0x20) != 0) {
              local_132 = local_f1 ^ 0xff;
            }
            local_131 = local_132;
          }
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x19e4,
                            "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,(uint)(local_131 & 1));
            param_local._4_4_ = 1;
          }
        }
        else if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x19d1,
                          "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,0);
          param_local._4_4_ = 1;
        }
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1992,
                  "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1992,
                "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckBlock)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags)	
	PARAM_INT_DEF(ptr)		
	PARAM_FLOAT_DEF(xofs)	
	PARAM_FLOAT_DEF(yofs)	
	PARAM_FLOAT_DEF(zofs)	
	PARAM_ANGLE_DEF(angle)	

	AActor *mobj = COPY_AAPTR(self, ptr);

	//Needs at least one state jump to work. 
	if (!mobj)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (!(flags & CBF_ABSOLUTEANGLE))
	{
		angle += self->Angles.Yaw;
	}

	DVector3 oldpos = mobj->Pos();
	DVector3 pos;

	if (flags & CBF_ABSOLUTEPOS)
	{
		pos = { xofs, yofs, zofs };
	}
	else
	{
		double s = angle.Sin();
		double c = angle.Cos();
		pos = mobj->Vec3Offset(xofs * c + yofs * s, xofs * s - yofs * c, zofs);
	}
	
	// Next, try checking the position based on the sensitivity desired.
	// If checking for dropoffs, set the z so we can have maximum flexibility.
	// Otherwise, set origin and set it back after testing.

	bool checker = false;
	if (flags & CBF_DROPOFF)
	{
		// Unfortunately, whenever P_CheckMove returned false, that means it could
		// ignore a variety of flags mainly because of P_CheckPosition. This
		// results in picking up false positives due to actors or lines being in the way
		// when they clearly should not be.

		int fpass = PCM_DROPOFF;
		if (flags & CBF_NOACTORS)	fpass |= PCM_NOACTORS;
		if (flags & CBF_NOLINES)	fpass |= PCM_NOLINES;
		mobj->SetZ(pos.Z);
		checker = P_CheckMove(mobj, pos, fpass);
		mobj->SetZ(oldpos.Z);
	}
	else
	{
		mobj->SetOrigin(pos, true);
		checker = P_TestMobjLocation(mobj);
		mobj->SetOrigin(oldpos, true);
	}
	
	if (checker)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (mobj->BlockingMobj)
	{
		AActor *setter = (flags & CBF_SETONPTR) ? mobj : self;
		if (setter)
		{
			if (flags & CBF_SETTARGET)	setter->target = mobj->BlockingMobj;
			if (flags & CBF_SETMASTER)	setter->master = mobj->BlockingMobj;
			if (flags & CBF_SETTRACER)	setter->tracer = mobj->BlockingMobj;
		}
	}

	//[MC] I don't know why I let myself be persuaded not to include a flag.
	//If an actor is loaded with pointers, they don't really have any options to spare.
	//Also, fail if a dropoff or a step is too great to pass over when checking for dropoffs.
	
	ACTION_RETURN_BOOL((!(flags & CBF_NOACTORS) && (mobj->BlockingMobj)) || (!(flags & CBF_NOLINES) && mobj->BlockingLine != NULL) ||
		((flags & CBF_DROPOFF) && !checker));
}